

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O3

png_byte png_unpremultiply(png_uint_32 component,png_uint_32 alpha,png_uint_32 reciprocal)

{
  uint uVar1;
  png_byte pVar2;
  
  pVar2 = 0xff;
  if (0x7f < alpha && component < alpha) {
    if (component == 0) {
      return '\0';
    }
    uVar1 = component * 0xff;
    if (alpha < 0xff7f) {
      uVar1 = reciprocal * component + 0x40 >> 7;
    }
    pVar2 = (png_byte)
            (((uint)png_sRGB_delta[uVar1 >> 0xf] * (uVar1 & 0x7fff) >> 0xc) +
             (uint)png_sRGB_base[uVar1 >> 0xf] >> 8);
  }
  return pVar2;
}

Assistant:

static png_byte
png_unpremultiply(png_uint_32 component, png_uint_32 alpha,
    png_uint_32 reciprocal/*from the above macro*/)
{
   /* The following gives 1.0 for an alpha of 0, which is fine, otherwise if 0/0
    * is represented as some other value there is more likely to be a
    * discontinuity which will probably damage compression when moving from a
    * fully transparent area to a nearly transparent one.  (The assumption here
    * is that opaque areas tend not to be 0 intensity.)
    *
    * There is a rounding problem here; if alpha is less than 128 it will end up
    * as 0 when scaled to 8 bits.  To avoid introducing spurious colors into the
    * output change for this too.
    */
   if (component >= alpha || alpha < 128)
      return 255;

   /* component<alpha, so component/alpha is less than one and
    * component*reciprocal is less than 2^31.
    */
   else if (component > 0)
   {
      /* The test is that alpha/257 (rounded) is less than 255, the first value
       * that becomes 255 is 65407.
       * NOTE: this must agree with the PNG_DIV257 macro (which must, therefore,
       * be exact!)  [Could also test reciprocal != 0]
       */
      if (alpha < 65407)
      {
         component *= reciprocal;
         component += 64; /* round to nearest */
         component >>= 7;
      }

      else
         component *= 255;

      /* Convert the component to sRGB. */
      return (png_byte)PNG_sRGB_FROM_LINEAR(component);
   }

   else
      return 0;
}